

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm-functions.cpp
# Opt level: O0

size_t arangodb::velocypack::anon_unknown_0::JSONStringCopyCheckUtf8SSE42
                 (uint8_t *dst,uint8_t *src,size_t limit)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  ulong in_RDX;
  undefined1 (*in_RSI) [16];
  undefined8 *in_RDI;
  __m128i s;
  __m128i s_1;
  int x;
  size_t count;
  __m128i r;
  int local_74;
  size_t local_70;
  ulong local_50;
  undefined1 (*local_48) [16];
  undefined8 *local_40;
  size_t local_38;
  
  local_70 = 0;
  local_50 = in_RDX;
  local_48 = in_RSI;
  local_40 = in_RDI;
  while( true ) {
    if (local_50 < 0x10) {
      if (local_50 == 0) {
        local_38 = local_70;
      }
      else {
        auVar3[8] = ' ';
        auVar3[9] = ' ';
        auVar3[10] = ' ';
        auVar3[0xb] = ' ';
        auVar3[0xc] = ' ';
        auVar3[0xd] = ' ';
        auVar3[0xe] = ' ';
        auVar3[0xf] = ' ';
        auVar3[0] = ' ';
        auVar3[1] = '!';
        auVar3[2] = '#';
        auVar3[3] = '[';
        auVar3[4] = ']';
        auVar3[5] = '\x7f';
        auVar3[6] = ' ';
        auVar3[7] = ' ';
        local_74 = pcmpistri(auVar3,*local_48,0x14);
        if ((int)local_50 < local_74) {
          local_74 = (int)local_50;
        }
        memcpy(local_40,local_48,(long)local_74);
        local_38 = (long)local_74 + local_70;
      }
      return local_38;
    }
    uVar1 = *(undefined8 *)(*local_48 + 8);
    auVar2[8] = ' ';
    auVar2[9] = ' ';
    auVar2[10] = ' ';
    auVar2[0xb] = ' ';
    auVar2[0xc] = ' ';
    auVar2[0xd] = ' ';
    auVar2[0xe] = ' ';
    auVar2[0xf] = ' ';
    auVar2[0] = ' ';
    auVar2[1] = '!';
    auVar2[2] = '#';
    auVar2[3] = '[';
    auVar2[4] = ']';
    auVar2[5] = '\x7f';
    auVar2[6] = ' ';
    auVar2[7] = ' ';
    iVar4 = pcmpistri(auVar2,*local_48,0x14);
    if (iVar4 < 0x10) break;
    *local_40 = *(undefined8 *)*local_48;
    local_40[1] = uVar1;
    local_48 = local_48 + 1;
    local_40 = local_40 + 2;
    local_50 = local_50 - 0x10;
    local_70 = local_70 + 0x10;
  }
  memcpy(local_40,local_48,(long)iVar4);
  return (long)iVar4 + local_70;
}

Assistant:

std::size_t JSONStringCopyCheckUtf8SSE42(uint8_t* dst, uint8_t const* src,
                                         std::size_t limit) {
  alignas(16) static unsigned char const ranges[17] =
      "\x20\x21\x23\x5b\x5d\x7f          ";
  //= "\x01\x1f\x80\xff\"\"\\\\\"\"\"\"\"\"\"\"";
  __m128i const r = _mm_load_si128(reinterpret_cast<__m128i const*>(ranges));
  std::size_t count = 0;
  int x = 0;
  while (limit >= 16) {
    __m128i const s = _mm_loadu_si128(reinterpret_cast<__m128i const*>(src));
    x = _mm_cmpistri(r, /* 8, */ s, /* 16, */
                     _SIDD_UBYTE_OPS | _SIDD_CMP_RANGES |
                         _SIDD_NEGATIVE_POLARITY | _SIDD_LEAST_SIGNIFICANT);
    if (x < 16) {
      memcpy(dst, src, x);
      count += x;
      return count;
    }
    _mm_storeu_si128(reinterpret_cast<__m128i*>(dst), s);
    src += 16;
    dst += 16;
    limit -= 16;
    count += 16;
  }
  if (limit == 0) {
    return count;
  }
  __m128i const s = _mm_loadu_si128(reinterpret_cast<__m128i const*>(src));
  x = _mm_cmpistri(r, /* 8, */ s, /* limit, */
                   _SIDD_UBYTE_OPS | _SIDD_CMP_RANGES |
                       _SIDD_NEGATIVE_POLARITY | _SIDD_LEAST_SIGNIFICANT);
  if (x > static_cast<int>(limit)) {
    x = static_cast<int>(limit);
  }
  memcpy(dst, src, x);
  count += x;
  return count;
}